

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O2

int __thiscall jwt::algorithm::rsa::verify(rsa *this,string *data,string *signature)

{
  int iVar1;
  int extraout_EAX;
  EVP_MD_CTX *ctx_00;
  EVP_MD *type;
  signature_verification_exception *psVar2;
  ulong e;
  char *__rhs;
  unique_ptr<evp_md_ctx_st,_void_(*)(evp_md_ctx_st_*)> ctx;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ctx_00 = (EVP_MD_CTX *)EVP_MD_CTX_new();
  ctx._M_t.super___uniq_ptr_impl<evp_md_ctx_st,_void_(*)(evp_md_ctx_st_*)>._M_t.
  super__Tuple_impl<0UL,_evp_md_ctx_st_*,_void_(*)(evp_md_ctx_st_*)>.
  super__Tuple_impl<1UL,_void_(*)(evp_md_ctx_st_*)>.
  super__Head_base<1UL,_void_(*)(evp_md_ctx_st_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(evp_md_ctx_st_*),_false>)EVP_MD_CTX_free;
  ctx._M_t.super___uniq_ptr_impl<evp_md_ctx_st,_void_(*)(evp_md_ctx_st_*)>._M_t.
  super__Tuple_impl<0UL,_evp_md_ctx_st_*,_void_(*)(evp_md_ctx_st_*)>.
  super__Head_base<0UL,_evp_md_ctx_st_*,_false>._M_head_impl = (evp_md_ctx_st *)ctx_00;
  if (ctx_00 == (EVP_MD_CTX *)0x0) {
    psVar2 = (signature_verification_exception *)__cxa_allocate_exception(0x10);
    signature_verification_exception::signature_verification_exception
              (psVar2,"failed to verify signature: could not create context");
  }
  else {
    type = (EVP_MD *)(*this->md)();
    iVar1 = EVP_DigestInit(ctx_00,type);
    if (iVar1 == 0) {
      psVar2 = (signature_verification_exception *)__cxa_allocate_exception(0x10);
      signature_verification_exception::signature_verification_exception
                (psVar2,"failed to verify signature: VerifyInit failed");
    }
    else {
      iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)
                               ctx._M_t.
                               super___uniq_ptr_impl<evp_md_ctx_st,_void_(*)(evp_md_ctx_st_*)>._M_t.
                               super__Tuple_impl<0UL,_evp_md_ctx_st_*,_void_(*)(evp_md_ctx_st_*)>.
                               super__Head_base<0UL,_evp_md_ctx_st_*,_false>._M_head_impl,
                               (data->_M_dataplus)._M_p,data->_M_string_length);
      if (iVar1 != 0) {
        iVar1 = EVP_VerifyFinal((EVP_MD_CTX *)
                                ctx._M_t.
                                super___uniq_ptr_impl<evp_md_ctx_st,_void_(*)(evp_md_ctx_st_*)>._M_t
                                .super__Tuple_impl<0UL,_evp_md_ctx_st_*,_void_(*)(evp_md_ctx_st_*)>.
                                super__Head_base<0UL,_evp_md_ctx_st_*,_false>._M_head_impl,
                                (uchar *)(signature->_M_dataplus)._M_p,
                                (uint)signature->_M_string_length,
                                (EVP_PKEY *)
                                (this->pkey).
                                super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (iVar1 == 1) {
          std::unique_ptr<evp_md_ctx_st,_void_(*)(evp_md_ctx_st_*)>::~unique_ptr(&ctx);
          return extraout_EAX;
        }
        psVar2 = (signature_verification_exception *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_a8,iVar1);
        std::operator+(&local_88,"evp verify final failed: ",&local_a8);
        std::operator+(&local_68,&local_88," ");
        e = ERR_get_error();
        __rhs = ERR_error_string(e,(char *)0x0);
        std::operator+(&local_48,&local_68,__rhs);
        signature_verification_exception::signature_verification_exception(psVar2,&local_48);
        __cxa_throw(psVar2,&signature_verification_exception::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      psVar2 = (signature_verification_exception *)__cxa_allocate_exception(0x10);
      signature_verification_exception::signature_verification_exception
                (psVar2,"failed to verify signature: VerifyUpdate failed");
    }
  }
  __cxa_throw(psVar2,&signature_verification_exception::typeinfo,std::runtime_error::~runtime_error)
  ;
}

Assistant:

void verify(const std::string& data, const std::string& signature) const {
#ifdef OPENSSL10
				std::unique_ptr<EVP_MD_CTX, decltype(&EVP_MD_CTX_destroy)> ctx(EVP_MD_CTX_create(), EVP_MD_CTX_destroy);
#else
				std::unique_ptr<EVP_MD_CTX, decltype(&EVP_MD_CTX_free)> ctx(EVP_MD_CTX_create(), EVP_MD_CTX_free);
#endif
				if (!ctx)
					throw signature_verification_exception("failed to verify signature: could not create context");
				if (!EVP_VerifyInit(ctx.get(), md()))
					throw signature_verification_exception("failed to verify signature: VerifyInit failed");
				if (!EVP_VerifyUpdate(ctx.get(), data.data(), data.size()))
					throw signature_verification_exception("failed to verify signature: VerifyUpdate failed");
				auto res = EVP_VerifyFinal(ctx.get(), (const unsigned char*)signature.data(), static_cast<unsigned int>(signature.size()), pkey.get());
				if (res != 1)
					throw signature_verification_exception("evp verify final failed: " + std::to_string(res) + " " + ERR_error_string(ERR_get_error(), NULL));
			}